

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O0

void units::removeEscapeSequences(string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type sVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  value_type nc;
  size_type eloc;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
         find_first_of(in_stack_ffffffffffffffe0,(char)((uint)in_stack_ffffffffffffffdc >> 0x18),
                       0x6e2bac);
  while (this_00 = this,
        sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(in_RDI),
        this < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar1 - 1)) {
    pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](this,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    in_stack_ffffffffffffffdc = (int)*pvVar2;
    if ((((in_stack_ffffffffffffffdc - 0x28U < 2) || (in_stack_ffffffffffffffdc - 0x5bU < 3)) ||
        (in_stack_ffffffffffffffdc == 0x7b)) || (in_stack_ffffffffffffffdc == 0x7d)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (this_00,CONCAT17(*pvVar2,in_stack_ffffffffffffffe8),(size_type)this);
    }
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_first_of(this,(char)((uint)in_stack_ffffffffffffffdc >> 0x18),0x6e2c59);
  }
  return;
}

Assistant:

static void removeEscapeSequences(std::string& str)
{
    auto eloc = str.find_first_of('\\');
    while (eloc < str.size() - 1) {
        auto nc = str[eloc + 1];
        switch (nc) {
            case '\\':
            case '{':
            case '}':
            case '(':
            case ')':
            case '[':
            case ']':
                str.erase(eloc, 1);
                break;
            default:
                break;
        }
        eloc = str.find_first_of('\\', eloc + 1);
    }
}